

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Gia_ManCorrReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iLit1;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  pGVar5 = Gia_ObjReprObj(p,iVar1);
  if (pGVar5 == (Gia_Obj_t *)0x0) {
    if (pObj->Value == 0xffffffff) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                      ,0x2a1,"void Gia_ManCorrReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar5 = Gia_ObjFanin0(pObj);
      Gia_ManCorrReduce_rec(pNew,p,pGVar5);
      pGVar5 = Gia_ObjFanin1(pObj);
      Gia_ManCorrReduce_rec(pNew,p,pGVar5);
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar4 = Gia_ManHashAnd(pNew,iVar1,iLit1);
      pObj->Value = uVar4;
    }
  }
  else {
    Gia_ManCorrReduce_rec(pNew,p,pGVar5);
    uVar4 = pGVar5->Value;
    uVar2 = Gia_ObjPhaseReal(pGVar5);
    uVar3 = Gia_ObjPhaseReal(pObj);
    uVar4 = Abc_LitNotCond(uVar4,uVar2 ^ uVar3);
    pObj->Value = uVar4;
  }
  return;
}

Assistant:

void Gia_ManCorrReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}